

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint128.cpp
# Opt level: O3

string * __thiscall
pstore::uint128::to_hex_string_abi_cxx11_(string *__return_storage_ptr__,uint128 *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  to_hex<std::back_insert_iterator<std::__cxx11::string>>
            (this,(back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   )__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string uint128::to_hex_string () const {
        std::string result;
        result.reserve (hex_string_length);
        this->to_hex (std::back_inserter (result));
        return result;
    }